

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

BOOL __thiscall
Js::JavascriptArray::SetArrayLikeObjects
          (JavascriptArray *this,RecyclableObject *pDestObj,BigIndex idxDest,Var aItem)

{
  ScriptContext *scriptContext;
  uint32 value;
  BOOL BVar1;
  uint64 value_00;
  undefined1 local_78 [8];
  PropertyDescriptor propertyDescriptor;
  BigIndex idxDest_local;
  PropertyRecord *propertyRecord;
  
  idxDest_local._0_8_ = idxDest._0_8_;
  propertyDescriptor._40_4_ = SUB84(pDestObj,0);
  scriptContext =
       (((((this->super_ArrayObject).super_DynamicObject.super_RecyclableObject.type.ptr)->
         javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
  if (propertyDescriptor._40_4_ == -1) {
    value_00 = BigIndex::GetBigIndex((BigIndex *)&propertyDescriptor.Configurable);
    JavascriptOperators::GetPropertyIdForInt
              (value_00,scriptContext,(PropertyRecord **)&idxDest_local.bigIndex);
  }
  else {
    value = BigIndex::GetSmallIndex((BigIndex *)&propertyDescriptor.Configurable);
    JavascriptOperators::GetPropertyIdForInt
              (value,scriptContext,(PropertyRecord **)&idxDest_local.bigIndex);
  }
  PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_78);
  PropertyDescriptor::SetConfigurable((PropertyDescriptor *)local_78,true);
  PropertyDescriptor::SetEnumerable((PropertyDescriptor *)local_78,true);
  PropertyDescriptor::SetWritable((PropertyDescriptor *)local_78,true);
  PropertyDescriptor::SetValue((PropertyDescriptor *)local_78,(Var)idxDest.bigIndex);
  BVar1 = JavascriptObject::DefineOwnPropertyHelper
                    ((RecyclableObject *)this,*(PropertyId *)(idxDest_local.bigIndex + 8),
                     (PropertyDescriptor *)local_78,scriptContext,false);
  return BVar1;
}

Assistant:

BOOL JavascriptArray::SetArrayLikeObjects(RecyclableObject* pDestObj, BigIndex idxDest, Var aItem)
    {
        ScriptContext* scriptContext = pDestObj->GetScriptContext();

        PropertyRecord const * propertyRecord;
        if (idxDest.IsSmallIndex())
        {
            JavascriptOperators::GetPropertyIdForInt(idxDest.GetSmallIndex(), scriptContext, &propertyRecord);
        }
        else
        {
            JavascriptOperators::GetPropertyIdForInt(idxDest.GetBigIndex(), scriptContext, &propertyRecord);
        }

        PropertyDescriptor propertyDescriptor;
        propertyDescriptor.SetConfigurable(true);
        propertyDescriptor.SetEnumerable(true);
        propertyDescriptor.SetWritable(true);
        propertyDescriptor.SetValue(aItem);
        return JavascriptObject::DefineOwnPropertyHelper(pDestObj, propertyRecord->GetPropertyId(), propertyDescriptor, scriptContext, false);
    }